

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits_test.cpp
# Opt level: O2

void __thiscall Morton2_Basics_Test::TestBody(Morton2_Basics_Test *this)

{
  uint64_t uVar1;
  ulong uVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  bool bVar7;
  AssertionResult gtest_ar_1;
  AssertHelper local_68;
  AssertionResult gtest_ar;
  uint32_t y;
  uint32_t x;
  AssertHelper local_48;
  uint32_t yp;
  uint32_t xp;
  uint32_t m;
  
  uVar1 = pbrt::EncodeMorton2(0x57,0xc5);
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_3_ = 0xb1;
  m = (uint32_t)uVar1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"m","0b1011000100110111",&m,(int *)&gtest_ar_1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/bits_test.cpp"
               ,0x3f,pcVar6);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  pbrt::RNG::SetSequence((RNG *)&gtest_ar,0x303f);
  iVar4 = 100000;
  while (bVar7 = iVar4 != 0, iVar4 = iVar4 + -1, bVar7) {
    uVar5 = gtest_ar._4_4_ >> 0xd ^ (uint)((ulong)gtest_ar._0_8_ >> 0x1b);
    bVar3 = gtest_ar._7_1_ >> 3;
    x = uVar5 >> bVar3 | uVar5 << 0x20 - bVar3;
    uVar2 = gtest_ar._0_8_ * 0x5851f42d4c957f2d + (long)gtest_ar.message_.ptr_;
    gtest_ar._0_8_ = uVar2 * 0x5851f42d4c957f2d + (long)gtest_ar.message_.ptr_;
    uVar5 = (uint)(uVar2 >> 0x2d) ^ (uint)(uVar2 >> 0x1b);
    bVar3 = (byte)(uVar2 >> 0x3b);
    y = uVar5 >> bVar3 | uVar5 << 0x20 - bVar3;
    uVar1 = pbrt::EncodeMorton2(x,y);
    pbrt::DecodeMorton2(uVar1,&xp,&yp);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&gtest_ar_1,"x","xp",&x,&xp);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_68);
      pcVar6 = "";
      if (gtest_ar_1.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/bits_test.cpp"
                 ,0x55,pcVar6);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_68);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&gtest_ar_1,"y","yp",&y,&yp);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_68);
      pcVar6 = "";
      if (gtest_ar_1.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/bits_test.cpp"
                 ,0x56,pcVar6);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_68);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
  }
  return;
}

Assistant:

TEST(Morton2, Basics) {
    uint16_t x = 0b01010111, y = 0b11000101;
    uint32_t m = EncodeMorton2(x, y);
    EXPECT_EQ(m, 0b1011000100110111);

#if 0
    for (int x = 0; x <= 65535; ++x)
        for (int y = 0; y <= 65535; ++y) {
            uint32_t m = EncodeMorton2(x, y);
            uint16_t xp, yp;
            DecodeMorton2(m, &xp, &yp);

            EXPECT_EQ(x, xp);
            EXPECT_EQ(y, yp);
        }
#endif

    RNG rng(12351);
    for (int i = 0; i < 100000; ++i) {
        uint32_t x = rng.Uniform<uint32_t>();
        uint32_t y = rng.Uniform<uint32_t>();
        uint64_t m = EncodeMorton2(x, y);

        uint32_t xp, yp;
        DecodeMorton2(m, &xp, &yp);
        EXPECT_EQ(x, xp);
        EXPECT_EQ(y, yp);
    }
}